

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::MatchGroupInst::Exec
          (MatchGroupInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  UnicodeDataCaseMapper *pUVar2;
  Type TVar3;
  Char CVar4;
  GroupInfo *pGVar5;
  Type pRVar6;
  StandardChars<char16_t> *pSVar7;
  code *pcVar8;
  Matcher *pMVar9;
  bool bVar10;
  Char CVar11;
  char16 cVar12;
  char16 cVar13;
  uint uVar14;
  BOOL BVar15;
  codepoint_t codePointValue;
  undefined4 *puVar16;
  unsigned_long uVar17;
  uint uVar18;
  int iVar19;
  Type *pTVar21;
  uint uVar22;
  long lVar23;
  undefined8 local_78;
  unsigned_long lastOcc;
  uint local_68 [2];
  uint tblidx;
  uint acth;
  Matcher *local_58;
  anon_class_8_1_b578bc12 toCanonical;
  codepoint_t local_44;
  Char local_34;
  anon_class_8_1_b578bc12 aVar20;
  
  uVar18 = (this->super_GroupMixin).groupId;
  lVar23 = (long)(int)uVar18;
  local_58 = matcher;
  if ((lVar23 < 0) || (((matcher->program).ptr)->numGroups <= uVar18)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                        "groupId >= 0 && groupId < program->numGroups");
    if (!bVar10) {
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar16 = 0;
  }
  pGVar5 = (local_58->groupInfos).ptr;
  uVar18 = pGVar5[lVar23].length;
  if (1 < uVar18 + 1) {
    uVar14 = *inputOffset;
    if (inputLength - uVar14 < uVar18) {
LAB_00ef68a4:
      bVar10 = Matcher::Fail(local_58,input,inputOffset,instPointer,contStack,assertionStack,qcTicks
                            );
      return bVar10;
    }
    uVar22 = pGVar5[lVar23].offset;
    uVar18 = uVar18 + uVar22;
    aVar20.matcher = (Matcher *)(ulong)uVar18;
    TVar3 = ((local_58->program).ptr)->flags;
    if ((TVar3 & IgnoreCaseRegexFlag) == NoRegexFlags) {
      pRVar6 = local_58->stats;
      do {
        if (pRVar6 != (Type)0x0) {
          puVar1 = &pRVar6->numCompares;
          *puVar1 = *puVar1 + 1;
        }
        if (input[uVar22] != input[uVar14]) {
          *inputOffset = uVar14 + 1;
          goto LAB_00ef68a4;
        }
        uVar22 = uVar22 + 1;
        uVar14 = uVar14 + 1;
      } while (uVar22 < uVar18);
      *inputOffset = uVar14;
    }
    else {
      toCanonical.matcher = aVar20.matcher;
      if ((TVar3 & UnicodeRegexFlag) == NoRegexFlags) {
        do {
          if (local_58->stats != (Type)0x0) {
            puVar1 = &local_58->stats->numCompares;
            *puVar1 = *puVar1 + 1;
          }
          pSVar7 = (local_58->standardChars).ptr;
          local_34 = input[uVar22];
          pUVar2 = &pSVar7->unicodeDataCaseMapper;
          uVar18 = (uint)(ushort)local_34;
          if ((ushort)local_34 < 0x100) {
            BVar15 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                               (&pUVar2->toEquivs,uVar18);
            if (BVar15 == 0) {
              uVar17 = (pSVar7->unicodeDataCaseMapper).toEquivs.defv;
            }
            else {
              uVar17 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::
                       GetDirectMap(&pUVar2->toEquivs,uVar18);
            }
          }
          else {
            bVar10 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                               (&pUVar2->toEquivs,uVar18,&local_78);
            pTVar21 = &(pSVar7->unicodeDataCaseMapper).toEquivs.defv;
            if (bVar10) {
              pTVar21 = &local_78;
            }
            uVar17 = *pTVar21;
          }
          if (uVar17 != 0xffffffffffffffff) {
            local_34 = (Char)uVar17;
          }
          pSVar7 = (local_58->standardChars).ptr;
          uVar18 = *inputOffset;
          *inputOffset = uVar18 + 1;
          CVar11 = input[uVar18];
          pUVar2 = &pSVar7->unicodeDataCaseMapper;
          if ((ushort)CVar11 < 0x100) {
            BVar15 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                               (&pUVar2->toEquivs,(uint)(ushort)CVar11);
            if (BVar15 == 0) {
              uVar17 = (pSVar7->unicodeDataCaseMapper).toEquivs.defv;
            }
            else {
              uVar17 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::
                       GetDirectMap(&pUVar2->toEquivs,(uint)(ushort)CVar11);
            }
          }
          else {
            bVar10 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                               (&pUVar2->toEquivs,(uint)(ushort)CVar11,&local_78);
            pTVar21 = &(pSVar7->unicodeDataCaseMapper).toEquivs.defv;
            if (bVar10) {
              pTVar21 = &local_78;
            }
            uVar17 = *pTVar21;
          }
          if (uVar17 != 0xffffffffffffffff) {
            CVar11 = (Char)uVar17;
          }
          if (local_34 != CVar11) goto LAB_00ef6a54;
          uVar22 = uVar22 + 1;
        } while (uVar22 < (uint)toCanonical.matcher);
      }
      else if (uVar22 < uVar18) {
        do {
          CVar11 = input[uVar22];
          codePointValue = (codepoint_t)(ushort)CVar11;
          bVar10 = Js::NumberUtilities::IsSurrogateLowerPart(codePointValue);
          acth = 1;
          if ((bVar10) && (uVar22 + 1 != (uint)aVar20.matcher)) {
            CVar4 = input[uVar22 + 1];
            bVar10 = Js::NumberUtilities::IsSurrogateUpperPart((uint)(ushort)CVar4);
            aVar20 = toCanonical;
            if (bVar10) {
              codePointValue =
                   Js::NumberUtilities::SurrogatePairAsCodePoint
                             ((uint)(ushort)CVar11,(uint)(ushort)CVar4);
              acth = 2;
              aVar20 = toCanonical;
            }
          }
          if (*inputOffset < inputLength) {
            local_44 = (codepoint_t)(ushort)input[*inputOffset];
            bVar10 = Js::NumberUtilities::IsSurrogateLowerPart(local_44);
            iVar19 = 1;
            if ((bVar10) && (*inputOffset + 1 != inputLength)) {
              tblidx = (uint)(ushort)input[*inputOffset + 1];
              bVar10 = Js::NumberUtilities::IsSurrogateUpperPart(tblidx);
              if (bVar10) {
                local_44 = Js::NumberUtilities::SurrogatePairAsCodePoint(local_44,tblidx);
                iVar19 = 2;
              }
            }
            *inputOffset = *inputOffset + iVar19;
            aVar20.matcher = toCanonical.matcher;
          }
          bVar10 = Js::NumberUtilities::IsInSupplementaryPlane(codePointValue);
          pMVar9 = local_58;
          if (bVar10) {
            local_68[0] = 0;
            local_68[1] = 0;
            CaseInsensitive::RangeToEquivClass
                      (local_68,codePointValue,codePointValue,local_68 + 1,(codepoint_t *)&local_78)
            ;
            if (((local_44 != (codepoint_t)local_78) && (local_44 != local_78._4_4_)) &&
               (local_44 != (codepoint_t)lastOcc)) {
              bVar10 = local_44 == lastOcc._4_4_;
              goto LAB_00ef6a06;
            }
          }
          else {
            cVar12 = CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_>::
                     ToCanonical(&((local_58->standardChars).ptr)->caseFoldingCaseMapper,
                                 (char16)codePointValue);
            cVar13 = CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_>::
                     ToCanonical(&((pMVar9->standardChars).ptr)->caseFoldingCaseMapper,
                                 (char16)local_44);
            bVar10 = cVar12 == cVar13;
            aVar20 = toCanonical;
LAB_00ef6a06:
            if (!bVar10) {
LAB_00ef6a54:
              bVar10 = Matcher::Fail(local_58,input,inputOffset,instPointer,contStack,assertionStack
                                     ,qcTicks);
              return bVar10;
            }
          }
          uVar22 = uVar22 + acth;
        } while (uVar22 < (uint)aVar20.matcher);
      }
    }
  }
  *instPointer = *instPointer + 5;
  return false;
}

Assistant:

inline bool MatchGroupInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        GroupInfo* const info = matcher.GroupIdToGroupInfo(groupId);
        if (!info->IsUndefined() && info->length > 0)
        {
            if (info->length > inputLength - inputOffset)
            {
                return matcher.Fail(FAIL_PARAMETERS);
            }

            CharCount groupOffset = info->offset;
            const CharCount groupEndOffset = groupOffset + info->length;

            bool isCaseInsensitiveMatch = (matcher.program->flags & IgnoreCaseRegexFlag) != 0;
            bool isCodePointList = (matcher.program->flags & UnicodeRegexFlag) != 0;

            // This is the only place in the runtime machinery we need to convert characters to their equivalence class
            if (isCaseInsensitiveMatch && isCodePointList)
            {
                auto getNextCodePoint = [=](CharCount &offset, CharCount endOffset, codepoint_t &codePoint) {
                    if (endOffset <= offset)
                    {
                        return false;
                    }

                    Char lowerPart = input[offset];
                    if (!Js::NumberUtilities::IsSurrogateLowerPart(lowerPart) || offset + 1 == endOffset)
                    {
                        codePoint = lowerPart;
                        offset += 1;
                        return true;
                    }

                    Char upperPart = input[offset + 1];
                    if (!Js::NumberUtilities::IsSurrogateUpperPart(upperPart))
                    {
                        codePoint = lowerPart;
                        offset += 1;
                    }
                    else
                    {
                        codePoint = Js::NumberUtilities::SurrogatePairAsCodePoint(lowerPart, upperPart);
                        offset += 2;
                    }

                    return true;
                };

                codepoint_t equivs[CaseInsensitive::EquivClassSize];
                while (true)
                {
                    codepoint_t groupCodePoint;
                    bool hasGroupCodePoint = getNextCodePoint(groupOffset, groupEndOffset, groupCodePoint);
                    if (!hasGroupCodePoint)
                    {
                        break;
                    }

                    // We don't need to verify that there is a valid input code point since at the beginning
                    // of the function, we make sure that the length of the input is at least as long as the
                    // length of the group.
                    codepoint_t inputCodePoint;
                    getNextCodePoint(inputOffset, inputLength, inputCodePoint);

                    bool doesMatch = false;
                    if (!Js::NumberUtilities::IsInSupplementaryPlane(groupCodePoint))
                    {
                        auto toCanonical = [&](codepoint_t c) {
                            return matcher.standardChars->ToCanonical(
                                CaseInsensitive::MappingSource::CaseFolding,
                                static_cast<char16>(c));
                        };
                        doesMatch = (toCanonical(groupCodePoint) == toCanonical(inputCodePoint));
                    }
                    else
                    {
                        uint tblidx = 0;
                        uint acth = 0;
                        CaseInsensitive::RangeToEquivClass(tblidx, groupCodePoint, groupCodePoint, acth, equivs);
                        CompileAssert(CaseInsensitive::EquivClassSize == 4);
                        doesMatch =
                            inputCodePoint == equivs[0]
                            || inputCodePoint == equivs[1]
                            || inputCodePoint == equivs[2]
                            || inputCodePoint == equivs[3];
                    }

                    if (!doesMatch)
                    {
                        return matcher.Fail(FAIL_PARAMETERS);
                    }
                }
            }
            else if (isCaseInsensitiveMatch)
            {
                do
                {
#if ENABLE_REGEX_CONFIG_OPTIONS
                    matcher.CompStats();
#endif
                    auto toCanonical = [&](CharCount &offset) {
                        return matcher.standardChars->ToCanonical(CaseInsensitive::MappingSource::UnicodeData, input[offset++]);
                    };

                    if (toCanonical(groupOffset) != toCanonical(inputOffset))
                    {
                        return matcher.Fail(FAIL_PARAMETERS);
                    }
                }
                while (groupOffset < groupEndOffset);
            }
            else
            {
                do
                {
#if ENABLE_REGEX_CONFIG_OPTIONS
                    matcher.CompStats();
#endif
                    if (input[groupOffset++] != input[inputOffset++])
                    {
                        return matcher.Fail(FAIL_PARAMETERS);
                    }
                }
                while (groupOffset < groupEndOffset);
            }
        }
        // else: trivially match empty string

        instPointer += sizeof(*this);
        return false;
    }